

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psocks.c
# Opt level: O3

PsocksDataSink * pds_stdio(FILE **fp)

{
  stdio_sink *sink;
  
  sink = (stdio_sink *)safemalloc(1,0x58,0);
  setvbuf((FILE *)*fp,(char *)0x0,2,0);
  stdio_sink_init(sink,*fp);
  sink[2].binarysink_[0].write = (_func_void_BinarySink_ptr_void_ptr_size_t *)sink->binarysink_;
  setvbuf((FILE *)fp[1],(char *)0x0,2,0);
  stdio_sink_init(sink + 1,fp[1]);
  sink[2].binarysink_[0].writefmtv =
       (_func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *)sink[1].binarysink_;
  sink[2].fp = (FILE *)stdio_free;
  return (PsocksDataSink *)(sink + 2);
}

Assistant:

PsocksDataSink *pds_stdio(FILE *fp[2])
{
    PsocksDataSinkStdio *pdss = snew(PsocksDataSinkStdio);

    for (size_t i = 0; i < 2; i++) {
        setvbuf(fp[i], NULL, _IONBF, 0);
        stdio_sink_init(&pdss->sink[i], fp[i]);
        pdss->pds.s[i] = BinarySink_UPCAST(&pdss->sink[i]);
    }

    pdss->pds.free = stdio_free;

    return &pdss->pds;
}